

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

Abc_Cex_t * Gia_Sim2GenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  void *__ptr;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  pAVar3 = Abc_CexAlloc(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,iFrame + 1);
  pAVar3->iFrame = iFrame;
  pAVar3->iPo = iOut;
  iVar4 = pAVar3->nRegs;
  __ptr = malloc((long)nWords << 2);
  if (-1 < iFrame) {
    iVar1 = 0;
    do {
      if (pAig->nRegs < pAig->vCis->nSize) {
        iVar5 = 0;
        do {
          lVar6 = (ulong)(uint)nWords + 1;
          if (0 < nWords) {
            do {
              uVar2 = Gia_ManRandom(0);
              *(uint *)((long)__ptr + lVar6 * 4 + -8) = uVar2;
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          if ((*(uint *)((long)__ptr + (long)(iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0) {
            (&pAVar3[1].iPo)[iVar5 + iVar4 >> 5] =
                 (&pAVar3[1].iPo)[iVar5 + iVar4 >> 5] | 1 << ((byte)(iVar5 + iVar4) & 0x1f);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < pAig->vCis->nSize - pAig->nRegs);
      }
      iVar4 = iVar4 + pAVar3->nPis;
      bVar7 = iVar1 != iFrame;
      iVar1 = iVar1 + 1;
    } while (bVar7);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Gia_Sim2GenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + i );
    }
    ABC_FREE( pData );
    return p;
}